

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

void vli_modMult_n(uECC_word_t *result,uECC_word_t *left,uECC_word_t *right)

{
  uECC_word_t uVar1;
  uECC_word_t borrow;
  uECC_word_t index;
  bitcount_t i;
  uECC_word_t *v [2];
  uECC_word_t tmp [8];
  uECC_word_t modMultiple [8];
  uECC_word_t product [8];
  uECC_word_t *right_local;
  uECC_word_t *left_local;
  uECC_word_t *result_local;
  
  borrow = 1;
  vli_mult(modMultiple + 7,left,right);
  vli_set(modMultiple + 3,curve_n);
  vli_clear(tmp + 7);
  for (index._4_4_ = 0; index._4_4_ < 0x101; index._4_4_ = index._4_4_ + 1) {
    uVar1 = vli2_sub((uECC_word_t *)tmp[-2 - borrow],(uECC_word_t *)tmp[borrow - 3],tmp + 7);
    borrow = (uECC_word_t)(int)(uint)((borrow != uVar1 ^ 0xffU) & 1);
    vli2_rshift1(tmp + 7);
  }
  vli_set(result,(uECC_word_t *)tmp[borrow - 3]);
  return;
}

Assistant:

static void vli_modMult_n(uECC_word_t *result, const uECC_word_t *left, const uECC_word_t *right) {
    uECC_word_t product[2 * uECC_WORDS];
    uECC_word_t modMultiple[2 * uECC_WORDS];
    uECC_word_t tmp[2 * uECC_WORDS];
    uECC_word_t *v[2] = {tmp, product};
    bitcount_t i;
    uECC_word_t index = 1;

    vli_mult(product, left, right);
    vli_set(modMultiple + uECC_WORDS, curve_n); /* works if curve_n has its highest bit set */
    vli_clear(modMultiple);

    for (i = 0; i <= uECC_BYTES * 8; ++i) {
        uECC_word_t borrow = vli2_sub(v[1 - index], v[index], modMultiple);
        index = !(index ^ borrow); /* Swap the index if there was no borrow */
        vli2_rshift1(modMultiple);
    }
    vli_set(result, v[index]);
}